

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<const_kj::ReadableDirectory_*> * __thiscall
kj::ArrayBuilder<const_kj::ReadableDirectory_*>::operator=
          (ArrayBuilder<const_kj::ReadableDirectory_*> *this,
          ArrayBuilder<const_kj::ReadableDirectory_*> *other)

{
  ArrayBuilder<const_kj::ReadableDirectory_*> *other_local;
  ArrayBuilder<const_kj::ReadableDirectory_*> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (ReadableDirectory **)0x0;
  other->pos = (RemoveConst<const_kj::ReadableDirectory_*> *)0x0;
  other->endPtr = (ReadableDirectory **)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }